

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

socket_t httplib::detail::create_client_socket
                   (string *host,string *ip,int port,int address_family,bool tcp_nodelay,
                   SocketOptions *socket_options,time_t connection_timeout_sec,
                   time_t connection_timeout_usec,time_t read_timeout_sec,time_t read_timeout_usec,
                   time_t write_timeout_sec,time_t write_timeout_usec,string *intf,Error *error)

{
  _Manager_type p_Var1;
  Error *pEVar2;
  socket_t sVar3;
  Error EVar4;
  long lVar5;
  string **ppsVar6;
  undefined8 *puVar7;
  anon_class_72_9_423fa509 in_stack_ffffffffffffff30;
  int local_7c;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  string *local_58;
  int *local_50;
  Error *local_48;
  time_t *local_40;
  time_t *local_38;
  time_t *local_30;
  time_t *local_28;
  time_t *local_20;
  time_t *local_18;
  
  pEVar2 = error;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_60 = socket_options->_M_invoker;
  p_Var1 = (socket_options->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(socket_options->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(socket_options->super__Function_base)._M_functor + 8);
    (socket_options->super__Function_base)._M_manager = (_Manager_type)0x0;
    socket_options->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  local_58 = intf;
  local_50 = &local_7c;
  local_48 = error;
  local_40 = &connection_timeout_sec;
  local_38 = &connection_timeout_usec;
  local_30 = &read_timeout_sec;
  local_28 = &read_timeout_usec;
  local_20 = &write_timeout_sec;
  local_18 = &write_timeout_usec;
  ppsVar6 = &local_58;
  puVar7 = (undefined8 *)&stack0xffffffffffffff30;
  local_7c = address_family;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar6;
    ppsVar6 = ppsVar6 + 1;
    puVar7 = puVar7 + 1;
  }
  sVar3 = create_socket<httplib::detail::create_client_socket(std::__cxx11::string_const&,std::__cxx11::string_const&,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (host,ip,port,address_family,0,tcp_nodelay,(SocketOptions *)&local_78,
                     in_stack_ffffffffffffff30);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  EVar4 = Success;
  if (sVar3 == -1) {
    if (*pEVar2 != Success) {
      return -1;
    }
    EVar4 = Connection;
  }
  *pEVar2 = EVar4;
  return sVar3;
}

Assistant:

inline socket_t create_client_socket(
    const std::string &host, const std::string &ip, int port,
    int address_family, bool tcp_nodelay, SocketOptions socket_options,
    time_t connection_timeout_sec, time_t connection_timeout_usec,
    time_t read_timeout_sec, time_t read_timeout_usec, time_t write_timeout_sec,
    time_t write_timeout_usec, const std::string &intf, Error &error) {
  auto sock = create_socket(
      host, ip, port, address_family, 0, tcp_nodelay, std::move(socket_options),
      [&](socket_t sock2, struct addrinfo &ai) -> bool {
        if (!intf.empty()) {
#ifdef USE_IF2IP
          auto ip_from_if = if2ip(address_family, intf);
          if (ip_from_if.empty()) { ip_from_if = intf; }
          if (!bind_ip_address(sock2, ip_from_if.c_str())) {
            error = Error::BindIPAddress;
            return false;
          }
#endif
        }

        set_nonblocking(sock2, true);

        auto ret =
            ::connect(sock2, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen));

        if (ret < 0) {
          if (is_connection_error()) {
            error = Error::Connection;
            return false;
          }
          error = wait_until_socket_is_ready(sock2, connection_timeout_sec,
                                             connection_timeout_usec);
          if (error != Error::Success) { return false; }
        }

        set_nonblocking(sock2, false);

        {
#ifdef _WIN32
          auto timeout = static_cast<uint32_t>(read_timeout_sec * 1000 +
                                               read_timeout_usec / 1000);
          setsockopt(sock2, SOL_SOCKET, SO_RCVTIMEO,
                     reinterpret_cast<const char *>(&timeout), sizeof(timeout));
#else
          timeval tv;
          tv.tv_sec = static_cast<long>(read_timeout_sec);
          tv.tv_usec = static_cast<decltype(tv.tv_usec)>(read_timeout_usec);
          setsockopt(sock2, SOL_SOCKET, SO_RCVTIMEO,
                     reinterpret_cast<const void *>(&tv), sizeof(tv));
#endif
        }
        {

#ifdef _WIN32
          auto timeout = static_cast<uint32_t>(write_timeout_sec * 1000 +
                                               write_timeout_usec / 1000);
          setsockopt(sock2, SOL_SOCKET, SO_SNDTIMEO,
                     reinterpret_cast<const char *>(&timeout), sizeof(timeout));
#else
          timeval tv;
          tv.tv_sec = static_cast<long>(write_timeout_sec);
          tv.tv_usec = static_cast<decltype(tv.tv_usec)>(write_timeout_usec);
          setsockopt(sock2, SOL_SOCKET, SO_SNDTIMEO,
                     reinterpret_cast<const void *>(&tv), sizeof(tv));
#endif
        }

        error = Error::Success;
        return true;
      });

  if (sock != INVALID_SOCKET) {
    error = Error::Success;
  } else {
    if (error == Error::Success) { error = Error::Connection; }
  }

  return sock;
}